

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void game::userTurn(Game *game)

{
  ulong uVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  int i;
  int j;
  uint local_44;
  uint local_40;
  uint local_3c;
  Game *local_38;
  
  local_44 = 0;
  uVar1 = CONCAT71((int7)((ulong)&local_44 >> 8),1);
  bVar3 = true;
  bVar4 = true;
  local_38 = game;
  do {
    local_3c = (uint)uVar1;
    while (bVar4) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"X:  ",4);
      std::istream::operator>>((istream *)&std::cin,(int *)&local_44);
      if (local_44 < 3) {
        bVar4 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_2850,0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
    }
    while (bVar3) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Y:  ",4);
      std::istream::operator>>((istream *)&std::cin,(int *)&local_40);
      if (local_40 < 3) {
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_2870,0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
    }
    if (local_38->bord[(int)local_44][(int)local_40] == ' ') {
      uVar1 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_287a,0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      bVar4 = true;
      bVar3 = true;
      uVar1 = (ulong)local_3c;
    }
  } while ((uVar1 & 1) != 0);
  local_38->bord[(int)local_44][(int)local_40] = local_38->userChar;
  return;
}

Assistant:

void userTurn(Game *game){
        int i = 0,j;
        bool flag_i = true, flag_j = true, flag_all = true;
        while (flag_all) {
            while (flag_i) {
                std::cout << std::endl << "X:  ";
                std::cin >> i;
                if ((i < 0) || (i > 2)) {
                    std::cout << "Введите x корректно" << std::endl;
                } else {
                    flag_i = false;
                }
            }

            while (flag_j) {
                std::cout << std::endl << "Y:  ";
                std::cin >> j;
                if ((j < 0) || (j > 2)) {
                    std::cout << "Введите y корректно" << std::endl;
                } else {
                    flag_j = false;
                }
            }
            if (game->bord[i][j] == ' '){
                flag_all = false;
            }else{
                std::cout << "Не жульничайте" << std::endl;
                flag_i = true;
                flag_j = true;
            }
        }
        game->bord[i][j] = game->userChar;
    }